

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.cpp
# Opt level: O0

void libtorrent::aux::ssl::set_host_name(stream_handle_type s,string *name,error_code *ec)

{
  void *parg;
  error_code *ec_local;
  string *name_local;
  stream_handle_type s_local;
  
  parg = (void *)::std::__cxx11::string::c_str();
  SSL_ctrl((SSL *)s,0x37,0,parg);
  return;
}

Assistant:

void set_host_name(stream_handle_type s, std::string const& name, error_code& ec)
{
#if defined TORRENT_USE_OPENSSL
	TORRENT_UNUSED(ec);
#if defined __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wold-style-cast"
#pragma clang diagnostic ignored "-Wcast-qual"
#endif
	SSL_set_tlsext_host_name(s, name.c_str());
#if defined __clang__
#pragma clang diagnostic pop
#endif

#elif defined TORRENT_USE_GNUTLS
	s->set_host_name(name, ec);
#endif
}